

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framework.h
# Opt level: O2

void __thiscall hedg::Framework::initialize(Framework *this)

{
  vector<std::thread,_std::allocator<std::thread>_> *this_00;
  Publisher *pPVar1;
  undefined8 __p;
  int nThreads;
  undefined1 local_1a0 [32];
  _Prime_rehash_policy local_180 [21];
  
  local_1a0._24_8_ = MarketGenerator::generate;
  local_180[0]._M_max_load_factor = 0.0;
  local_180[0]._4_4_ = 0;
  this_00 = &this->threads;
  local_1a0._0_8_ = &this->gen;
  std::vector<std::thread,std::allocator<std::thread>>::
  emplace_back<void(hedg::MarketGenerator::*)(),hedg::MarketGenerator*>
            ((vector<std::thread,std::allocator<std::thread>> *)this_00,(type *)(local_1a0 + 0x18),
             (MarketGenerator **)local_1a0);
  local_1a0._24_8_ = Publisher::run;
  local_180[0]._M_max_load_factor = 0.0;
  local_180[0]._4_4_ = 0;
  pPVar1 = &this->pub;
  local_1a0._0_8_ = pPVar1;
  std::vector<std::thread,std::allocator<std::thread>>::
  emplace_back<void(hedg::Publisher::*)(),hedg::Publisher*>
            ((vector<std::thread,std::allocator<std::thread>> *)this_00,(type *)(local_1a0 + 0x18),
             (Publisher **)local_1a0);
  local_1a0._24_8_ = Publisher::order_subscribe;
  local_180[0]._M_max_load_factor = 0.0;
  local_180[0]._4_4_ = 0;
  local_1a0._0_8_ = pPVar1;
  local_1a0._8_8_ = this;
  local_1a0._16_8_ = &this->context;
  std::vector<std::thread,std::allocator<std::thread>>::
  emplace_back<void(hedg::Publisher::*)(boost::asio::io_context&,boost::asio::ssl::context&),hedg::Publisher*,std::reference_wrapper<boost::asio::io_context>,std::reference_wrapper<boost::asio::ssl::context>>
            ((vector<std::thread,std::allocator<std::thread>> *)this_00,(type *)(local_1a0 + 0x18),
             (Publisher **)local_1a0,(reference_wrapper<boost::asio::io_context> *)(local_1a0 + 8),
             (reference_wrapper<boost::asio::ssl::context> *)(local_1a0 + 0x10));
  local_1a0._24_8_ = Publisher::clean_up_markets;
  local_180[0]._M_max_load_factor = 0.0;
  local_180[0]._4_4_ = 0;
  local_1a0._0_8_ = pPVar1;
  local_1a0._8_8_ = this;
  local_1a0._16_8_ = &this->context;
  std::vector<std::thread,std::allocator<std::thread>>::
  emplace_back<void(hedg::Publisher::*)(boost::asio::io_context&,boost::asio::ssl::context&),hedg::Publisher*,std::reference_wrapper<boost::asio::io_context>,std::reference_wrapper<boost::asio::ssl::context>>
            ((vector<std::thread,std::allocator<std::thread>> *)this_00,(type *)(local_1a0 + 0x18),
             (Publisher **)local_1a0,(reference_wrapper<boost::asio::io_context> *)(local_1a0 + 8),
             (reference_wrapper<boost::asio::ssl::context> *)(local_1a0 + 0x10));
  local_1a0._24_8_ = Publisher::get_data;
  local_180[0]._M_max_load_factor = 0.0;
  local_180[0]._4_4_ = 0;
  local_1a0._0_8_ = pPVar1;
  std::vector<std::thread,std::allocator<std::thread>>::
  emplace_back<void(hedg::Publisher::*)(),hedg::Publisher*>
            ((vector<std::thread,std::allocator<std::thread>> *)this_00,(type *)(local_1a0 + 0x18),
             (Publisher **)local_1a0);
  Market_Handler::Market_Handler((Market_Handler *)(local_1a0 + 0x18),&this->markets);
  std::make_unique<hedg::Market_Handler,hedg::Market_Handler>((Market_Handler *)local_1a0);
  __p = local_1a0._0_8_;
  local_1a0._0_8_ =
       (__uniq_ptr_impl<hedg::Market_Handler,_std::default_delete<hedg::Market_Handler>_>)0x0;
  std::__uniq_ptr_impl<hedg::Market_Handler,_std::default_delete<hedg::Market_Handler>_>::reset
            ((__uniq_ptr_impl<hedg::Market_Handler,_std::default_delete<hedg::Market_Handler>_> *)
             &this->handler,(pointer)__p);
  std::unique_ptr<hedg::Market_Handler,_std::default_delete<hedg::Market_Handler>_>::~unique_ptr
            ((unique_ptr<hedg::Market_Handler,_std::default_delete<hedg::Market_Handler>_> *)
             local_1a0);
  Market_Handler::~Market_Handler((Market_Handler *)(local_1a0 + 0x18));
  nThreads = std::thread::hardware_concurrency();
  ctpl::thread_pool::resize(&this->t_pool,nThreads);
  this->initialized = true;
  return;
}

Assistant:

void initialize() {
		threads.emplace_back(&MarketGenerator::generate, &gen);
		threads.emplace_back(&Publisher::run, &pub);
		threads.emplace_back(&Publisher::order_subscribe, &pub, std::ref(service), std::ref(context));
		threads.emplace_back(&Publisher::clean_up_markets, &pub, std::ref(service), std::ref(context));
		threads.emplace_back(&Publisher::get_data, &pub);
		handler = std::make_unique<Market_Handler>(Market_Handler(markets));
		t_pool.resize(std::thread::hardware_concurrency());
		initialized = true;

	}